

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

civil_second
absl::lts_20250127::time_internal::cctz::anon_unknown_0::YearShift(civil_second *cs,year_t shift)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  year_t yVar6;
  year_t shift_local;
  civil_second *cs_local;
  
  yVar6 = detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::year(cs);
  iVar1 = detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::month(cs)
  ;
  iVar2 = detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::day(cs);
  iVar3 = detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::hour(cs);
  iVar4 = detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::minute
                    (cs);
  iVar5 = detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::second
                    (cs);
  detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::civil_time
            ((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *)&cs_local,
             yVar6 + shift,(long)iVar1,(long)iVar2,(long)iVar3,(long)iVar4,(long)iVar5);
  return (civil_second)_cs_local;
}

Assistant:

inline civil_second YearShift(const civil_second& cs, year_t shift) {
  return civil_second(cs.year() + shift, cs.month(), cs.day(), cs.hour(),
                      cs.minute(), cs.second());
}